

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

tdefl_status
tdefl_compress(tdefl_compressor *d,void *pIn_buf,size_t *pIn_buf_size,void *pOut_buf,
              size_t *pOut_buf_size,tdefl_flush flush)

{
  mz_uint *pmVar1;
  mz_uint8 *pmVar2;
  mz_uint16 *pmVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ushort uVar9;
  tdefl_status tVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  mz_ulong mVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  short sVar18;
  uint uVar19;
  ushort uVar20;
  uint uVar21;
  byte *pbVar22;
  uint uVar23;
  mz_uint8 *pmVar24;
  mz_uint mVar25;
  uint uVar26;
  mz_uint8 mVar27;
  byte *pbVar29;
  mz_uint8 mVar30;
  int iVar32;
  byte *pbVar33;
  long lVar34;
  long lVar35;
  mz_uint mVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  mz_uint mVar40;
  size_t sVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  mz_uint8 *local_c0;
  mz_uint local_98;
  uint local_70;
  int local_58;
  int local_40;
  short sVar28;
  short sVar31;
  
  if (d == (tdefl_compressor *)0x0) {
    if (pIn_buf_size != (size_t *)0x0) {
      *pIn_buf_size = 0;
    }
    if (pOut_buf_size == (size_t *)0x0) {
      return TDEFL_STATUS_BAD_PARAM;
    }
    *pOut_buf_size = 0;
    return TDEFL_STATUS_BAD_PARAM;
  }
  d->m_pIn_buf = pIn_buf;
  d->m_pIn_buf_size = pIn_buf_size;
  d->m_pOut_buf = pOut_buf;
  d->m_pOut_buf_size = pOut_buf_size;
  d->m_pSrc = (mz_uint8 *)pIn_buf;
  if (pIn_buf_size == (size_t *)0x0) {
    sVar41 = 0;
  }
  else {
    sVar41 = *pIn_buf_size;
  }
  d->m_src_buf_left = sVar41;
  d->m_out_buf_ofs = 0;
  d->m_flush = flush;
  if ((((d->m_pPut_buf_func == (tdefl_put_buf_func_ptr)0x0) ==
        (pOut_buf != (void *)0x0 || pOut_buf_size != (size_t *)0x0)) &&
      (d->m_prev_return_status == TDEFL_STATUS_OKAY)) &&
     (flush == TDEFL_FINISH || d->m_wants_to_finish == 0)) {
    if (((pIn_buf_size == (size_t *)0x0) || (pIn_buf != (void *)0x0)) || (*pIn_buf_size == 0)) {
      if (((pOut_buf_size == (size_t *)0x0) || (pOut_buf != (void *)0x0)) || (*pOut_buf_size == 0))
      {
        d->m_wants_to_finish = d->m_wants_to_finish | (uint)(flush == TDEFL_FINISH);
        if ((d->m_output_flush_remaining == 0) && (d->m_finished == 0)) {
          if ((d->m_flags & 0xb4fff) == 0x4001) {
            uVar11 = d->m_lookahead_pos;
            local_98 = d->m_total_lz_bytes;
            mVar36 = d->m_num_flags_left;
            pbVar29 = d->m_pLZ_code_buf;
            pbVar33 = d->m_pLZ_flags;
            uVar37 = uVar11 & 0x7fff;
            pmVar2 = d->m_dict;
            mVar25 = d->m_lookahead_size;
            local_70 = d->m_dict_size;
            while ((sVar41 != 0 || ((d->m_flush != TDEFL_NO_FLUSH && (mVar25 != 0))))) {
              uVar42 = sVar41 & 0xffffffff;
              if (0x1000 - mVar25 <= sVar41) {
                uVar42 = (ulong)(0x1000 - mVar25);
              }
              uVar38 = uVar11 + mVar25;
              d->m_src_buf_left = sVar41 - uVar42;
              uVar17 = uVar42;
              while (uVar21 = (uint)uVar17, uVar21 != 0) {
                uVar38 = uVar38 & 0x7fff;
                uVar15 = (ulong)(0x8000 - uVar38);
                if (uVar21 <= 0x8000 - uVar38) {
                  uVar15 = uVar17;
                }
                memcpy(pmVar2 + uVar38,d->m_pSrc,uVar15);
                uVar39 = (uint)uVar15;
                if (uVar38 < 0x101) {
                  uVar17 = (ulong)(0x101 - uVar38);
                  if (uVar39 < 0x101 - uVar38) {
                    uVar17 = uVar15;
                  }
                  memcpy(d->m_dict + (ulong)uVar38 + 0x8000,d->m_pSrc,uVar17);
                }
                d->m_pSrc = d->m_pSrc + uVar15;
                uVar38 = uVar38 + uVar39;
                uVar17 = (ulong)(uVar21 - uVar39);
              }
              mVar25 = (int)uVar42 + mVar25;
              mVar40 = 0x8000 - mVar25;
              if (local_70 <= 0x8000 - mVar25) {
                mVar40 = local_70;
              }
              if ((d->m_flush == TDEFL_NO_FLUSH) && (local_70 = mVar40, mVar25 < 0x1000)) break;
              while (3 < mVar25) {
                uVar42 = (ulong)uVar37;
                uVar38 = *(uint *)(d->m_dict + uVar42);
                uVar21 = uVar38 & 0xfff ^ (uVar38 & 0xffffff) >> 0x11;
                uVar5 = d->m_hash[uVar21];
                uVar9 = (ushort)uVar11;
                d->m_hash[uVar21] = uVar9;
                uVar21 = uVar11 - uVar5;
                uVar20 = (ushort)uVar21;
                uVar21 = uVar21 & 0xffff;
                if ((mVar40 < uVar21) ||
                   (uVar17 = (ulong)(uVar5 & 0x7fff),
                   (*(uint *)(pmVar2 + uVar17) & 0xffffff) != (uVar38 & 0xffffff))) {
                  *pbVar29 = (byte)uVar38;
                  *pbVar33 = *pbVar33 >> 1;
                  pbVar29 = pbVar29 + 1;
                  uVar42 = (ulong)(uVar38 & 0xff);
                  uVar39 = 1;
                }
                else {
                  pmVar24 = d->m_dict + uVar42 + 0x100;
                  lVar35 = 0;
                  do {
                    sVar28 = *(short *)(d->m_dict + lVar35 + uVar42 + 2);
                    sVar31 = *(short *)(d->m_dict + lVar35 + uVar17 + 2);
                    if (sVar28 != sVar31) {
                      pmVar24 = d->m_dict + lVar35 + uVar42 + 2;
LAB_0013af11:
                      mVar30 = (mz_uint8)sVar31;
                      mVar27 = (mz_uint8)sVar28;
                      bVar44 = false;
                      goto LAB_0013af14;
                    }
                    sVar28 = *(short *)(d->m_dict + lVar35 + uVar42 + 4);
                    sVar31 = *(short *)(d->m_dict + lVar35 + uVar17 + 4);
                    if (sVar28 != sVar31) {
                      pmVar24 = d->m_dict + lVar35 + uVar42 + 4;
                      goto LAB_0013af11;
                    }
                    sVar28 = *(short *)(d->m_dict + lVar35 + uVar42 + 6);
                    sVar31 = *(short *)(d->m_dict + lVar35 + uVar17 + 6);
                    if (sVar28 != sVar31) {
                      pmVar24 = d->m_dict + lVar35 + uVar42 + 6;
                      goto LAB_0013af11;
                    }
                    sVar28 = *(short *)(d->m_dict + lVar35 + uVar42 + 8);
                    sVar31 = *(short *)(d->m_dict + lVar35 + uVar17 + 8);
                    if (sVar28 != sVar31) {
                      pmVar24 = d->m_dict + lVar35 + uVar42 + 8;
                      goto LAB_0013af11;
                    }
                    lVar35 = lVar35 + 8;
                  } while ((int)lVar35 != 0x100);
                  mVar27 = *pmVar24;
                  mVar30 = d->m_dict[uVar17 + 0x100];
                  bVar44 = true;
LAB_0013af14:
                  uVar39 = 0x102;
                  if (uVar9 == uVar5) {
                    uVar39 = 0;
                  }
                  if (!bVar44) {
                    uVar39 = (uint)(mVar27 == mVar30) |
                             (int)pmVar24 - ((int)pmVar2 + uVar37) & 0xfffffffe;
                  }
                  if ((uVar39 < 3) || ((0x1fff < uVar20 && (uVar39 == 3)))) {
                    *pbVar29 = (byte)uVar38;
                    *pbVar33 = *pbVar33 >> 1;
                    pbVar29 = pbVar29 + 1;
                    uVar42 = (ulong)(uVar38 & 0xff);
                    uVar39 = 1;
                  }
                  else {
                    if ((uVar5 == uVar9) || (0x8000 < uVar20)) {
                      __assert_fail("(cur_match_len >= TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 1) && (cur_match_dist <= TDEFL_LZ_DICT_SIZE)"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                                    ,0x5f2,"mz_bool tdefl_compress_fast(tdefl_compressor *)");
                    }
                    if (mVar25 <= uVar39) {
                      uVar39 = mVar25;
                    }
                    uVar21 = uVar21 - 1;
                    *pbVar29 = (byte)(uVar39 - 3);
                    *(short *)(pbVar29 + 1) = (short)uVar21;
                    pbVar29 = pbVar29 + 3;
                    *pbVar33 = *pbVar33 >> 1 | 0x80;
                    pbVar22 = "" + (uVar21 >> 8);
                    if (uVar21 < 0x200) {
                      pbVar22 = "" + (uVar21 & 0x1ff);
                    }
                    pmVar3 = d->m_huff_count[1] + *pbVar22;
                    *pmVar3 = *pmVar3 + 1;
                    uVar42 = (ulong)s_tdefl_len_sym[uVar39 - 3];
                  }
                }
                pmVar3 = d->m_huff_count[0] + uVar42;
                *pmVar3 = *pmVar3 + 1;
                bVar44 = mVar36 - 1 == 0;
                if (bVar44) {
                  pbVar33 = pbVar29;
                }
                mVar36 = mVar36 - 1;
                if (bVar44) {
                  mVar36 = 8;
                }
                mVar40 = mVar40 + uVar39;
                if (0x7fff < mVar40) {
                  mVar40 = 0x8000;
                }
                bVar43 = mVar25 < uVar39;
                mVar25 = mVar25 - uVar39;
                if (bVar43) {
                  __assert_fail("lookahead_size >= cur_match_len",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                                ,0x613,"mz_bool tdefl_compress_fast(tdefl_compressor *)");
                }
                pbVar29 = pbVar29 + bVar44;
                local_98 = local_98 + uVar39;
                uVar11 = uVar11 + uVar39;
                uVar37 = uVar37 + uVar39 & 0x7fff;
                if (d->m_lz_code_buf + 0xfff8 < pbVar29) {
                  d->m_lookahead_pos = uVar11;
                  d->m_lookahead_size = mVar25;
                  d->m_dict_size = mVar40;
                  d->m_total_lz_bytes = local_98;
                  d->m_pLZ_code_buf = pbVar29;
                  d->m_pLZ_flags = pbVar33;
                  d->m_num_flags_left = mVar36;
                  iVar12 = tdefl_flush_block(d,0);
                  if (iVar12 != 0) goto joined_r0x0013ba3a;
                  local_98 = d->m_total_lz_bytes;
                  pbVar29 = d->m_pLZ_code_buf;
                  pbVar33 = d->m_pLZ_flags;
                  mVar36 = d->m_num_flags_left;
                }
              }
              while (mVar25 = mVar25 - 1, mVar25 != 0xffffffff) {
                bVar4 = d->m_dict[uVar37];
                *pbVar29 = bVar4;
                *pbVar33 = *pbVar33 >> 1;
                local_98 = local_98 + 1;
                pbVar22 = pbVar29 + 1;
                mVar36 = mVar36 - 1;
                pbVar29 = pbVar29 + 2;
                if (mVar36 != 0) {
                  pbVar29 = pbVar22;
                  pbVar22 = pbVar33;
                }
                pbVar33 = pbVar22;
                if (mVar36 == 0) {
                  mVar36 = 8;
                }
                pmVar3 = d->m_huff_count[0] + bVar4;
                *pmVar3 = *pmVar3 + 1;
                uVar11 = uVar11 + 1;
                mVar40 = mVar40 + 1;
                if (0x7fff < mVar40) {
                  mVar40 = 0x8000;
                }
                if (d->m_lz_code_buf + 0xfff8 < pbVar29) {
                  d->m_lookahead_pos = uVar11;
                  d->m_lookahead_size = mVar25;
                  d->m_dict_size = mVar40;
                  d->m_total_lz_bytes = local_98;
                  d->m_pLZ_code_buf = pbVar29;
                  d->m_pLZ_flags = pbVar33;
                  d->m_num_flags_left = mVar36;
                  iVar12 = tdefl_flush_block(d,0);
                  if (iVar12 != 0) goto joined_r0x0013ba3a;
                  local_98 = d->m_total_lz_bytes;
                  pbVar29 = d->m_pLZ_code_buf;
                  pbVar33 = d->m_pLZ_flags;
                  mVar36 = d->m_num_flags_left;
                }
                uVar37 = uVar37 + 1 & 0x7fff;
              }
              sVar41 = d->m_src_buf_left;
              local_70 = mVar40;
              mVar25 = 0;
            }
            d->m_lookahead_pos = uVar11;
            d->m_lookahead_size = mVar25;
            d->m_dict_size = local_70;
            d->m_total_lz_bytes = local_98;
            d->m_pLZ_code_buf = pbVar29;
            d->m_pLZ_flags = pbVar33;
            d->m_num_flags_left = mVar36;
          }
          else {
            pmVar2 = d->m_dict;
            local_58 = (int)d + 0x92aa;
            local_c0 = (mz_uint8 *)pIn_buf;
            do {
              do {
                if (sVar41 == 0) {
                  if (flush == TDEFL_NO_FLUSH) {
                    uVar42 = 0;
                  }
                  else {
                    mVar25 = d->m_lookahead_size;
                    if (mVar25 != 0) goto LAB_0013b14f;
                    uVar42 = 0;
                  }
LAB_0013ba54:
                  d->m_pSrc = local_c0;
                  d->m_src_buf_left = uVar42;
                  goto LAB_0013ba67;
                }
                mVar25 = d->m_lookahead_size;
LAB_0013b14f:
                uVar11 = d->m_dict_size;
                if (uVar11 + mVar25 < 2) {
                  uVar42 = sVar41;
                  for (uVar17 = 0; iVar12 = (int)uVar17, sVar41 != uVar17; uVar17 = uVar17 + 1) {
                    if (0x101 < mVar25 + iVar12) goto LAB_0013b31f;
                    bVar4 = local_c0[uVar17];
                    mVar36 = d->m_lookahead_pos;
                    uVar37 = mVar25 + iVar12 + mVar36 & 0x7fff;
                    d->m_dict[uVar37] = bVar4;
                    if (uVar37 < 0x101) {
                      d->m_dict[(ulong)uVar37 + 0x8000] = bVar4;
                    }
                    d->m_lookahead_size = mVar25 + iVar12 + 1;
                    if (2 < mVar25 + uVar11 + 1 + iVar12) {
                      uVar38 = (mVar25 - 2) + iVar12 + mVar36 & 0x7fff;
                      uVar37 = (uint)bVar4 ^
                               (uint)d->m_dict[(mVar36 + mVar25 + iVar12) - 1 & 0x7fff] << 5 ^
                               (d->m_dict[uVar38] & 0x1f) << 10;
                      d->m_next[uVar38] = d->m_hash[uVar37];
                      d->m_hash[uVar37] = ((short)(mVar25 + iVar12) + (short)mVar36) - 2;
                    }
                    uVar42 = uVar42 - 1;
                  }
                  uVar42 = 0;
LAB_0013b31f:
                  uVar37 = mVar25 + iVar12;
                }
                else {
                  mVar36 = d->m_lookahead_pos;
                  uVar38 = (mVar36 + mVar25) - 2;
                  uVar21 = mVar36 + mVar25;
                  uVar42 = (ulong)((uint)d->m_dict[(mVar36 + mVar25) - 1 & 0x7fff] ^
                                  (uint)d->m_dict[uVar38 & 0x7fff] << 5);
                  uVar17 = sVar41 & 0xffffffff;
                  if (0x102 - mVar25 <= sVar41) {
                    uVar17 = (ulong)(0x102 - mVar25);
                  }
                  uVar37 = (int)uVar17 + mVar25;
                  d->m_lookahead_size = uVar37;
                  for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
                    uVar21 = uVar21 & 0x7fff;
                    bVar4 = local_c0[uVar15];
                    pmVar2[uVar21] = bVar4;
                    if (uVar21 < 0x101) {
                      d->m_dict[(ulong)uVar21 + 0x8000] = bVar4;
                    }
                    uVar42 = (ulong)(((uint)uVar42 & 0x3ff) << 5 ^ (uint)bVar4);
                    d->m_next[uVar38 & 0x7fff] = d->m_hash[uVar42];
                    d->m_hash[uVar42] = (mz_uint16)uVar38;
                    uVar21 = uVar21 + 1;
                    uVar38 = uVar38 + 1;
                  }
                  uVar42 = sVar41 - uVar17;
                }
                local_c0 = local_c0 + uVar17;
                uVar38 = 0x8000 - uVar37;
                if (uVar11 <= 0x8000 - uVar37) {
                  uVar38 = uVar11;
                }
                d->m_dict_size = uVar38;
                if ((flush == TDEFL_NO_FLUSH) && (uVar37 < 0x102)) goto LAB_0013ba54;
                uVar11 = d->m_saved_match_len;
                uVar21 = uVar11;
                if (uVar11 == 0) {
                  uVar21 = 2;
                }
                uVar39 = d->m_flags;
                uVar6 = d->m_lookahead_pos;
                uVar19 = uVar6 & 0x7fff;
                uVar17 = (ulong)uVar19;
                if ((uVar39 & 0x90000) == 0) {
                  if (0x102 < uVar37) {
                    __assert_fail("max_match_len <= TDEFL_MAX_MATCH_LEN",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                                  ,0x555,
                                  "void tdefl_find_match(tdefl_compressor *, mz_uint, mz_uint, mz_uint, mz_uint *, mz_uint *)"
                                 );
                  }
                  if (uVar21 < uVar37) {
                    local_40 = (int)pmVar2 + uVar19;
                    mVar25 = d->m_max_probes[0x1f < uVar21];
                    uVar26 = (uVar19 - 1) + uVar21;
                    lVar35 = (long)d->m_max_probes + (uVar17 - 0x14);
                    uVar15 = uVar17;
                    uVar8 = 0;
                    do {
                      sVar28 = *(short *)(pmVar2 + uVar26);
                      iVar12 = uVar21 - 1;
LAB_0013b44f:
                      do {
                        do {
                          mVar25 = mVar25 - 1;
                          uVar26 = uVar8;
                          uVar13 = uVar21;
                          if ((mVar25 == 0) || (uVar5 = d->m_next[uVar15], uVar5 == 0))
                          goto LAB_0013b655;
                          uVar23 = uVar6 - uVar5 & 0xffff;
                          if (uVar38 < uVar23) goto LAB_0013b655;
                          uVar16 = uVar5 & 0x7fff;
                          uVar15 = (ulong)uVar16;
                          if (*(short *)(pmVar2 + (iVar12 + uVar16)) != sVar28) {
                            uVar5 = d->m_next[uVar15];
                            if (uVar5 == 0) goto LAB_0013b655;
                            uVar23 = uVar6 - uVar5 & 0xffff;
                            if (uVar38 < uVar23) goto LAB_0013b655;
                            uVar16 = uVar5 & 0x7fff;
                            uVar15 = (ulong)uVar16;
                            if (*(short *)(pmVar2 + (iVar12 + uVar16)) != sVar28) {
                              uVar5 = d->m_next[uVar15];
                              if (uVar5 == 0) goto LAB_0013b655;
                              uVar23 = uVar6 - uVar5 & 0xffff;
                              if (uVar38 < uVar23) goto LAB_0013b655;
                              uVar16 = uVar5 & 0x7fff;
                              uVar15 = (ulong)uVar16;
                              if (*(short *)(pmVar2 + (iVar12 + uVar16)) != sVar28)
                              goto LAB_0013b44f;
                            }
                          }
                          if (uVar23 == 0) goto LAB_0013b655;
                        } while (*(short *)(pmVar2 + uVar15) != *(short *)(pmVar2 + uVar17));
                        lVar34 = 0;
                        while( true ) {
                          sVar31 = *(short *)(lVar35 + 0xca + lVar34);
                          sVar18 = *(short *)(d->m_dict + lVar34 + uVar15 + 2);
                          iVar32 = (int)lVar34;
                          iVar7 = (int)lVar35;
                          uVar26 = uVar23;
                          uVar13 = uVar37;
                          if (sVar31 != sVar18) break;
                          sVar31 = *(short *)(lVar35 + 0xcc + lVar34);
                          sVar18 = *(short *)(d->m_dict + lVar34 + uVar15 + 4);
                          if (sVar31 != sVar18) {
                            iVar32 = iVar32 + iVar7 + 0xcc;
                            goto LAB_0013b5e1;
                          }
                          sVar31 = *(short *)(lVar35 + 0xce + lVar34);
                          sVar18 = *(short *)(d->m_dict + lVar34 + uVar15 + 6);
                          if (sVar31 != sVar18) {
                            iVar32 = iVar32 + iVar7 + 0xce;
                            goto LAB_0013b5e1;
                          }
                          sVar31 = *(short *)(lVar35 + 0xd0 + lVar34);
                          sVar18 = *(short *)(d->m_dict + lVar34 + uVar15 + 8);
                          if (sVar31 != sVar18) {
                            iVar32 = iVar32 + iVar7 + 0xd0;
                            goto LAB_0013b5e1;
                          }
                          lVar34 = lVar34 + 8;
                          if ((int)lVar34 == 0x100) goto LAB_0013b655;
                        }
                        iVar32 = iVar32 + iVar7 + 0xca;
LAB_0013b5e1:
                        uVar16 = (uint)((char)sVar31 == (char)sVar18) |
                                 iVar32 - local_40 & 0xfffffffeU;
                      } while (uVar16 <= uVar21);
                      if (uVar37 <= uVar16) goto LAB_0013b655;
                      uVar26 = uVar16 + (uVar19 - 1);
                      uVar21 = uVar16;
                      uVar8 = uVar23;
                    } while( true );
                  }
LAB_0013b64b:
                  uVar26 = 0;
                  uVar13 = uVar21;
                }
                else {
                  if ((uVar39 >> 0x13 & 1) != 0 || uVar38 == 0) goto LAB_0013b64b;
                  uVar15 = 0;
                  do {
                    if (uVar37 == uVar15) goto LAB_0013b3c5;
                    iVar12 = (int)uVar15;
                    uVar15 = uVar15 + 1;
                  } while (pmVar2[(uVar6 & 0x7fff) + iVar12] == pmVar2[uVar6 - 1 & 0x7fff]);
                  uVar37 = (int)uVar15 - 1;
LAB_0013b3c5:
                  uVar26 = (uint)(2 < uVar37);
                  uVar13 = uVar37;
                  if (2 >= uVar37) {
                    uVar13 = 0;
                  }
                }
LAB_0013b655:
                if (((uVar13 == 3 && 0x1fff < uVar26) || (uVar19 == uVar26)) ||
                   (((uVar39 >> 0x11 & 1) != 0 && (uVar13 < 6)))) {
                  if (uVar11 != 0) {
LAB_0013b68f:
                    if ((uVar11 < 3) || (uVar37 = d->m_saved_match_dist - 1, 0x7fff < uVar37)) {
LAB_0013bb75:
                      __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                                    ,0x66d,
                                    "void tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)")
                      ;
                    }
                    d->m_total_lz_bytes = d->m_total_lz_bytes + uVar11;
                    *d->m_pLZ_code_buf = (mz_uint8)(uVar11 - 3);
                    d->m_pLZ_code_buf[1] = (mz_uint8)uVar37;
                    d->m_pLZ_code_buf[2] = (mz_uint8)(uVar37 >> 8);
                    d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                    *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                    pmVar1 = &d->m_num_flags_left;
                    *pmVar1 = *pmVar1 - 1;
                    if (*pmVar1 == 0) {
                      d->m_num_flags_left = 8;
                      pmVar24 = d->m_pLZ_code_buf;
                      d->m_pLZ_code_buf = pmVar24 + 1;
                      d->m_pLZ_flags = pmVar24;
                    }
                    pbVar29 = "" + (uVar37 >> 8);
                    if (uVar37 < 0x200) {
                      pbVar29 = "" + (uVar37 & 0x1ff);
                    }
                    pmVar3 = d->m_huff_count[1] + *pbVar29;
                    *pmVar3 = *pmVar3 + 1;
                    pmVar3 = d->m_huff_count[0] + s_tdefl_len_sym[uVar11 - 3];
                    *pmVar3 = *pmVar3 + 1;
                    uVar13 = d->m_saved_match_len - 1;
                    goto LAB_0013b743;
                  }
LAB_0013b91e:
                  bVar4 = d->m_dict[uVar17];
                  d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
                  pbVar29 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pbVar29 + 1;
                  *pbVar29 = bVar4;
                  *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
                  pmVar1 = &d->m_num_flags_left;
                  *pmVar1 = *pmVar1 - 1;
                  if (*pmVar1 == 0) {
                    d->m_num_flags_left = 8;
                    pmVar24 = d->m_pLZ_code_buf;
                    d->m_pLZ_code_buf = pmVar24 + 1;
                    d->m_pLZ_flags = pmVar24;
                  }
                  pmVar3 = d->m_huff_count[0] + bVar4;
                  *pmVar3 = *pmVar3 + 1;
LAB_0013b961:
                  uVar13 = 1;
                }
                else if (uVar11 == 0) {
                  if (uVar26 == 0) goto LAB_0013b91e;
                  if (((d->m_greedy_parsing == 0) && ((uVar39 >> 0x10 & 1) == 0)) && (uVar13 < 0x80)
                     ) goto LAB_0013b9f5;
                  if ((0x8000 < uVar26) || (uVar13 < 3)) goto LAB_0013bb75;
                  uVar11 = uVar26 - 1;
                  d->m_total_lz_bytes = d->m_total_lz_bytes + uVar13;
                  *d->m_pLZ_code_buf = (mz_uint8)(uVar13 - 3);
                  d->m_pLZ_code_buf[1] = (mz_uint8)uVar11;
                  d->m_pLZ_code_buf[2] = (mz_uint8)(uVar11 >> 8);
                  d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                  *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                  pmVar1 = &d->m_num_flags_left;
                  *pmVar1 = *pmVar1 - 1;
                  if (*pmVar1 == 0) {
                    d->m_num_flags_left = 8;
                    pmVar24 = d->m_pLZ_code_buf;
                    d->m_pLZ_code_buf = pmVar24 + 1;
                    d->m_pLZ_flags = pmVar24;
                  }
                  pbVar29 = "" + (uVar11 >> 8);
                  if (uVar26 < 0x201) {
                    pbVar29 = "" + (uVar11 & 0x1ff);
                  }
                  pmVar3 = d->m_huff_count[1] + *pbVar29;
                  *pmVar3 = *pmVar3 + 1;
                  pmVar3 = d->m_huff_count[0] + s_tdefl_len_sym[uVar13 - 3];
                  *pmVar3 = *pmVar3 + 1;
                }
                else {
                  if (uVar13 <= uVar11) goto LAB_0013b68f;
                  uVar11 = d->m_saved_lit;
                  d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
                  pmVar24 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar24 + 1;
                  *pmVar24 = (mz_uint8)uVar11;
                  *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
                  pmVar1 = &d->m_num_flags_left;
                  *pmVar1 = *pmVar1 - 1;
                  if (*pmVar1 == 0) {
                    d->m_num_flags_left = 8;
                    pmVar24 = d->m_pLZ_code_buf;
                    d->m_pLZ_code_buf = pmVar24 + 1;
                    d->m_pLZ_flags = pmVar24;
                  }
                  pmVar3 = d->m_huff_count[0] + (uVar11 & 0xff);
                  *pmVar3 = *pmVar3 + 1;
                  if (uVar13 < 0x80) {
LAB_0013b9f5:
                    d->m_saved_lit = (uint)d->m_dict[uVar17];
                    d->m_saved_match_dist = uVar26;
                    d->m_saved_match_len = uVar13;
                    goto LAB_0013b961;
                  }
                  uVar26 = uVar26 - 1;
                  if (0x7fff < uVar26) goto LAB_0013bb75;
                  d->m_total_lz_bytes = d->m_total_lz_bytes + uVar13;
                  *d->m_pLZ_code_buf = (mz_uint8)(uVar13 - 3);
                  d->m_pLZ_code_buf[1] = (mz_uint8)uVar26;
                  d->m_pLZ_code_buf[2] = (mz_uint8)(uVar26 >> 8);
                  d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                  *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                  pmVar1 = &d->m_num_flags_left;
                  *pmVar1 = *pmVar1 - 1;
                  if (*pmVar1 == 0) {
                    d->m_num_flags_left = 8;
                    pmVar24 = d->m_pLZ_code_buf;
                    d->m_pLZ_code_buf = pmVar24 + 1;
                    d->m_pLZ_flags = pmVar24;
                  }
                  pbVar29 = "" + (uVar26 >> 8);
                  if (uVar26 < 0x200) {
                    pbVar29 = "" + (uVar26 & 0x1ff);
                  }
                  pmVar3 = d->m_huff_count[1] + *pbVar29;
                  *pmVar3 = *pmVar3 + 1;
                  pmVar3 = d->m_huff_count[0] + s_tdefl_len_sym[uVar13 - 3];
                  *pmVar3 = *pmVar3 + 1;
LAB_0013b743:
                  d->m_saved_match_len = 0;
                }
                d->m_lookahead_pos = d->m_lookahead_pos + uVar13;
                if (d->m_lookahead_size < uVar13) {
                  __assert_fail("d->m_lookahead_size >= len_to_move",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                                ,0x704,"mz_bool tdefl_compress_normal(tdefl_compressor *)");
                }
                d->m_lookahead_size = d->m_lookahead_size - uVar13;
                uVar13 = uVar13 + d->m_dict_size;
                if (0x7fff < uVar13) {
                  uVar13 = 0x8000;
                }
                d->m_dict_size = uVar13;
                sVar41 = uVar42;
              } while ((d->m_pLZ_code_buf <= d->m_lz_code_buf + 0xfff8) &&
                      ((d->m_total_lz_bytes < 0x7c01 ||
                       (((uint)(((int)d->m_pLZ_code_buf - local_58) * 0x73) >> 7 <
                         d->m_total_lz_bytes && ((d->m_flags & 0x80000) == 0))))));
              d->m_pSrc = local_c0;
              d->m_src_buf_left = uVar42;
              iVar12 = tdefl_flush_block(d,0);
            } while (iVar12 == 0);
joined_r0x0013ba3a:
            if (iVar12 < 0) goto LAB_0013ba3c;
          }
LAB_0013ba67:
          if ((pIn_buf != (void *)0x0) && ((d->m_flags & 0x3000) != 0)) {
            mVar14 = mz_adler32((ulong)d->m_adler32,(uchar *)pIn_buf,(long)d->m_pSrc - (long)pIn_buf
                               );
            d->m_adler32 = (mz_uint)mVar14;
          }
          if ((((flush != TDEFL_NO_FLUSH) && (d->m_lookahead_size == 0)) && (d->m_src_buf_left == 0)
              ) && (d->m_output_flush_remaining == 0)) {
            iVar12 = tdefl_flush_block(d,flush);
            if (iVar12 < 0) {
LAB_0013ba3c:
              return d->m_prev_return_status;
            }
            d->m_finished = (uint)(flush == TDEFL_FINISH);
            if (flush == TDEFL_FULL_FLUSH) {
              d->m_dict_size = 0;
              memset(d->m_next,0,0x20000);
            }
          }
        }
        tVar10 = tdefl_flush_output_buffer(d);
        d->m_prev_return_status = tVar10;
        return tVar10;
      }
      goto LAB_0013aaa1;
    }
  }
  else {
LAB_0013aaa1:
    if (pIn_buf_size == (size_t *)0x0) goto LAB_0013aaaa;
  }
  *pIn_buf_size = 0;
LAB_0013aaaa:
  if (pOut_buf_size != (size_t *)0x0) {
    *pOut_buf_size = 0;
  }
  d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM;
  return TDEFL_STATUS_BAD_PARAM;
}

Assistant:

tdefl_status tdefl_compress(tdefl_compressor *d, const void *pIn_buf, size_t *pIn_buf_size, void *pOut_buf, size_t *pOut_buf_size, tdefl_flush flush)
{
    if (!d)
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return TDEFL_STATUS_BAD_PARAM;
    }

    d->m_pIn_buf = pIn_buf;
    d->m_pIn_buf_size = pIn_buf_size;
    d->m_pOut_buf = pOut_buf;
    d->m_pOut_buf_size = pOut_buf_size;
    d->m_pSrc = (const mz_uint8 *)(pIn_buf);
    d->m_src_buf_left = pIn_buf_size ? *pIn_buf_size : 0;
    d->m_out_buf_ofs = 0;
    d->m_flush = flush;

    if (((d->m_pPut_buf_func != NULL) == ((pOut_buf != NULL) || (pOut_buf_size != NULL))) || (d->m_prev_return_status != TDEFL_STATUS_OKAY) ||
        (d->m_wants_to_finish && (flush != TDEFL_FINISH)) || (pIn_buf_size && *pIn_buf_size && !pIn_buf) || (pOut_buf_size && *pOut_buf_size && !pOut_buf))
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return (d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM);
    }
    d->m_wants_to_finish |= (flush == TDEFL_FINISH);

    if ((d->m_output_flush_remaining) || (d->m_finished))
        return (d->m_prev_return_status = tdefl_flush_output_buffer(d));

#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN
    if (((d->m_flags & TDEFL_MAX_PROBES_MASK) == 1) &&
        ((d->m_flags & TDEFL_GREEDY_PARSING_FLAG) != 0) &&
        ((d->m_flags & (TDEFL_FILTER_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS | TDEFL_RLE_MATCHES)) == 0))
    {
        if (!tdefl_compress_fast(d))
            return d->m_prev_return_status;
    }
    else
#endif /* #if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN */
    {
        if (!tdefl_compress_normal(d))
            return d->m_prev_return_status;
    }

    if ((d->m_flags & (TDEFL_WRITE_ZLIB_HEADER | TDEFL_COMPUTE_ADLER32)) && (pIn_buf))
        d->m_adler32 = (mz_uint32)mz_adler32(d->m_adler32, (const mz_uint8 *)pIn_buf, d->m_pSrc - (const mz_uint8 *)pIn_buf);

    if ((flush) && (!d->m_lookahead_size) && (!d->m_src_buf_left) && (!d->m_output_flush_remaining))
    {
        if (tdefl_flush_block(d, flush) < 0)
            return d->m_prev_return_status;
        d->m_finished = (flush == TDEFL_FINISH);
        if (flush == TDEFL_FULL_FLUSH)
        {
            MZ_CLEAR_OBJ(d->m_hash);
            MZ_CLEAR_OBJ(d->m_next);
            d->m_dict_size = 0;
        }
    }

    return (d->m_prev_return_status = tdefl_flush_output_buffer(d));
}